

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void add_passes(Backend *backend)

{
  unique_ptr<backend::optimization::ExcessRegDelete,_std::default_delete<backend::optimization::ExcessRegDelete>_>
  *in_RDI;
  unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
  *in_stack_fffffffffffff8b8;
  Backend *in_stack_fffffffffffff8c0;
  Backend *this;
  unique_ptr<backend::codegen::BasicBlkRearrange,_std::default_delete<backend::codegen::BasicBlkRearrange>_>
  *in_stack_fffffffffffff8c8;
  unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
  *in_stack_fffffffffffff8d0;
  bool *in_stack_fffffffffffff8d8;
  bool *in_stack_fffffffffffff8e0;
  int *in_stack_fffffffffffff8e8;
  undefined1 local_308 [255];
  undefined1 local_209;
  undefined1 local_1f1;
  undefined1 local_1d9;
  unique_ptr<backend::optimization::ExcessRegDelete,_std::default_delete<backend::optimization::ExcessRegDelete>_>
  *local_8;
  
  local_8 = in_RDI;
  std::make_unique<optimization::sanity_check::SanityCheck>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::sanity_check::SanityCheck,std::default_delete<optimization::sanity_check::SanityCheck>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::sanity_check::SanityCheck,_std::default_delete<optimization::sanity_check::SanityCheck>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::sanity_check::SanityCheck,_std::default_delete<optimization::sanity_check::SanityCheck>_>
  ::~unique_ptr((unique_ptr<optimization::sanity_check::SanityCheck,_std::default_delete<optimization::sanity_check::SanityCheck>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::remove_temp_var::Remove_Temp_Var>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::remove_temp_var::Remove_Temp_Var,std::default_delete<optimization::remove_temp_var::Remove_Temp_Var>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::remove_temp_var::Remove_Temp_Var,_std::default_delete<optimization::remove_temp_var::Remove_Temp_Var>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::remove_temp_var::Remove_Temp_Var,_std::default_delete<optimization::remove_temp_var::Remove_Temp_Var>_>
  ::~unique_ptr((unique_ptr<optimization::remove_temp_var::Remove_Temp_Var,_std::default_delete<optimization::remove_temp_var::Remove_Temp_Var>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::const_propagation::Const_Propagation>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::const_propagation::Const_Propagation,std::default_delete<optimization::const_propagation::Const_Propagation>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
  ::~unique_ptr((unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::var_mir_fold::VarMirFold>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::var_mir_fold::VarMirFold,std::default_delete<optimization::var_mir_fold::VarMirFold>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::var_mir_fold::VarMirFold,_std::default_delete<optimization::var_mir_fold::VarMirFold>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::var_mir_fold::VarMirFold,_std::default_delete<optimization::var_mir_fold::VarMirFold>_>
  ::~unique_ptr((unique_ptr<optimization::var_mir_fold::VarMirFold,_std::default_delete<optimization::var_mir_fold::VarMirFold>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,_std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,_std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>_>
  ::~unique_ptr((unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,_std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::inlineFunc::Inline_Func>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::inlineFunc::Inline_Func,std::default_delete<optimization::inlineFunc::Inline_Func>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::inlineFunc::Inline_Func,_std::default_delete<optimization::inlineFunc::Inline_Func>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::inlineFunc::Inline_Func,_std::default_delete<optimization::inlineFunc::Inline_Func>_>
  ::~unique_ptr((unique_ptr<optimization::inlineFunc::Inline_Func,_std::default_delete<optimization::inlineFunc::Inline_Func>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::mergeBlocks::Merge_Block>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::mergeBlocks::Merge_Block,std::default_delete<optimization::mergeBlocks::Merge_Block>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::mergeBlocks::Merge_Block,_std::default_delete<optimization::mergeBlocks::Merge_Block>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::mergeBlocks::Merge_Block,_std::default_delete<optimization::mergeBlocks::Merge_Block>_>
  ::~unique_ptr((unique_ptr<optimization::mergeBlocks::Merge_Block,_std::default_delete<optimization::mergeBlocks::Merge_Block>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::common_expr_del::Common_Expr_Del>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::common_expr_del::Common_Expr_Del,std::default_delete<optimization::common_expr_del::Common_Expr_Del>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::common_expr_del::Common_Expr_Del,_std::default_delete<optimization::common_expr_del::Common_Expr_Del>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::common_expr_del::Common_Expr_Del,_std::default_delete<optimization::common_expr_del::Common_Expr_Del>_>
  ::~unique_ptr((unique_ptr<optimization::common_expr_del::Common_Expr_Del,_std::default_delete<optimization::common_expr_del::Common_Expr_Del>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::global_expr_move::Global_Expr_Mov>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::global_expr_move::Global_Expr_Mov,std::default_delete<optimization::global_expr_move::Global_Expr_Mov>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::global_expr_move::Global_Expr_Mov,_std::default_delete<optimization::global_expr_move::Global_Expr_Mov>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::global_expr_move::Global_Expr_Mov,_std::default_delete<optimization::global_expr_move::Global_Expr_Mov>_>
  ::~unique_ptr((unique_ptr<optimization::global_expr_move::Global_Expr_Mov,_std::default_delete<optimization::global_expr_move::Global_Expr_Mov>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::common_expr_del::Common_Expr_Del>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::common_expr_del::Common_Expr_Del,std::default_delete<optimization::common_expr_del::Common_Expr_Del>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::common_expr_del::Common_Expr_Del,_std::default_delete<optimization::common_expr_del::Common_Expr_Del>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::common_expr_del::Common_Expr_Del,_std::default_delete<optimization::common_expr_del::Common_Expr_Del>_>
  ::~unique_ptr((unique_ptr<optimization::common_expr_del::Common_Expr_Del,_std::default_delete<optimization::common_expr_del::Common_Expr_Del>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,_std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,_std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>_>
  ::~unique_ptr((unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,_std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::memvar_propagation::Memory_Var_Propagation>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::memvar_propagation::Memory_Var_Propagation,std::default_delete<optimization::memvar_propagation::Memory_Var_Propagation>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::memvar_propagation::Memory_Var_Propagation,_std::default_delete<optimization::memvar_propagation::Memory_Var_Propagation>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::memvar_propagation::Memory_Var_Propagation,_std::default_delete<optimization::memvar_propagation::Memory_Var_Propagation>_>
  ::~unique_ptr((unique_ptr<optimization::memvar_propagation::Memory_Var_Propagation,_std::default_delete<optimization::memvar_propagation::Memory_Var_Propagation>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::const_merge::Merge_Const>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::const_merge::Merge_Const,std::default_delete<optimization::const_merge::Merge_Const>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::const_merge::Merge_Const,_std::default_delete<optimization::const_merge::Merge_Const>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::const_merge::Merge_Const,_std::default_delete<optimization::const_merge::Merge_Const>_>
  ::~unique_ptr((unique_ptr<optimization::const_merge::Merge_Const,_std::default_delete<optimization::const_merge::Merge_Const>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::memvar_propagation::Memory_Var_Propagation>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::memvar_propagation::Memory_Var_Propagation,std::default_delete<optimization::memvar_propagation::Memory_Var_Propagation>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::memvar_propagation::Memory_Var_Propagation,_std::default_delete<optimization::memvar_propagation::Memory_Var_Propagation>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::memvar_propagation::Memory_Var_Propagation,_std::default_delete<optimization::memvar_propagation::Memory_Var_Propagation>_>
  ::~unique_ptr((unique_ptr<optimization::memvar_propagation::Memory_Var_Propagation,_std::default_delete<optimization::memvar_propagation::Memory_Var_Propagation>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::const_propagation::Const_Propagation>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::const_propagation::Const_Propagation,std::default_delete<optimization::const_propagation::Const_Propagation>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
  ::~unique_ptr((unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::loop_expand::Const_Loop_Expand>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::loop_expand::Const_Loop_Expand,std::default_delete<optimization::loop_expand::Const_Loop_Expand>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::loop_expand::Const_Loop_Expand,_std::default_delete<optimization::loop_expand::Const_Loop_Expand>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::loop_expand::Const_Loop_Expand,_std::default_delete<optimization::loop_expand::Const_Loop_Expand>_>
  ::~unique_ptr((unique_ptr<optimization::loop_expand::Const_Loop_Expand,_std::default_delete<optimization::loop_expand::Const_Loop_Expand>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::mergeBlocks::Merge_Block>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::mergeBlocks::Merge_Block,std::default_delete<optimization::mergeBlocks::Merge_Block>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::mergeBlocks::Merge_Block,_std::default_delete<optimization::mergeBlocks::Merge_Block>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::mergeBlocks::Merge_Block,_std::default_delete<optimization::mergeBlocks::Merge_Block>_>
  ::~unique_ptr((unique_ptr<optimization::mergeBlocks::Merge_Block,_std::default_delete<optimization::mergeBlocks::Merge_Block>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::const_propagation::Const_Propagation>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::const_propagation::Const_Propagation,std::default_delete<optimization::const_propagation::Const_Propagation>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
  ::~unique_ptr((unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::const_merge::Merge_Const>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::const_merge::Merge_Const,std::default_delete<optimization::const_merge::Merge_Const>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::const_merge::Merge_Const,_std::default_delete<optimization::const_merge::Merge_Const>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::const_merge::Merge_Const,_std::default_delete<optimization::const_merge::Merge_Const>_>
  ::~unique_ptr((unique_ptr<optimization::const_merge::Merge_Const,_std::default_delete<optimization::const_merge::Merge_Const>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::const_propagation::Const_Propagation>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::const_propagation::Const_Propagation,std::default_delete<optimization::const_propagation::Const_Propagation>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
  ::~unique_ptr((unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,_std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,_std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>_>
  ::~unique_ptr((unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,_std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::common_expr_del::Common_Expr_Del>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::common_expr_del::Common_Expr_Del,std::default_delete<optimization::common_expr_del::Common_Expr_Del>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::common_expr_del::Common_Expr_Del,_std::default_delete<optimization::common_expr_del::Common_Expr_Del>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::common_expr_del::Common_Expr_Del,_std::default_delete<optimization::common_expr_del::Common_Expr_Del>_>
  ::~unique_ptr((unique_ptr<optimization::common_expr_del::Common_Expr_Del,_std::default_delete<optimization::common_expr_del::Common_Expr_Del>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::memvar_propagation::Memory_Var_Propagation>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::memvar_propagation::Memory_Var_Propagation,std::default_delete<optimization::memvar_propagation::Memory_Var_Propagation>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::memvar_propagation::Memory_Var_Propagation,_std::default_delete<optimization::memvar_propagation::Memory_Var_Propagation>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::memvar_propagation::Memory_Var_Propagation,_std::default_delete<optimization::memvar_propagation::Memory_Var_Propagation>_>
  ::~unique_ptr((unique_ptr<optimization::memvar_propagation::Memory_Var_Propagation,_std::default_delete<optimization::memvar_propagation::Memory_Var_Propagation>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::const_propagation::Const_Propagation>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::const_propagation::Const_Propagation,std::default_delete<optimization::const_propagation::Const_Propagation>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
  ::~unique_ptr((unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::const_merge::Merge_Const>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::const_merge::Merge_Const,std::default_delete<optimization::const_merge::Merge_Const>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::const_merge::Merge_Const,_std::default_delete<optimization::const_merge::Merge_Const>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::const_merge::Merge_Const,_std::default_delete<optimization::const_merge::Merge_Const>_>
  ::~unique_ptr((unique_ptr<optimization::const_merge::Merge_Const,_std::default_delete<optimization::const_merge::Merge_Const>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::const_propagation::Const_Propagation>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::const_propagation::Const_Propagation,std::default_delete<optimization::const_propagation::Const_Propagation>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
  ::~unique_ptr((unique_ptr<optimization::const_propagation::Const_Propagation,_std::default_delete<optimization::const_propagation::Const_Propagation>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::cast_inst::Cast_Inst>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::cast_inst::Cast_Inst,std::default_delete<optimization::cast_inst::Cast_Inst>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::cast_inst::Cast_Inst,_std::default_delete<optimization::cast_inst::Cast_Inst>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::cast_inst::Cast_Inst,_std::default_delete<optimization::cast_inst::Cast_Inst>_>
  ::~unique_ptr((unique_ptr<optimization::cast_inst::Cast_Inst,_std::default_delete<optimization::cast_inst::Cast_Inst>_>
                 *)in_stack_fffffffffffff8c0);
  local_1d9 = 1;
  std::make_unique<optimization::memvar_propagation::Memory_Var_Propagation,bool>
            (in_stack_fffffffffffff8d8);
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::memvar_propagation::Memory_Var_Propagation,std::default_delete<optimization::memvar_propagation::Memory_Var_Propagation>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::memvar_propagation::Memory_Var_Propagation,_std::default_delete<optimization::memvar_propagation::Memory_Var_Propagation>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::memvar_propagation::Memory_Var_Propagation,_std::default_delete<optimization::memvar_propagation::Memory_Var_Propagation>_>
  ::~unique_ptr((unique_ptr<optimization::memvar_propagation::Memory_Var_Propagation,_std::default_delete<optimization::memvar_propagation::Memory_Var_Propagation>_>
                 *)in_stack_fffffffffffff8c0);
  local_1f1 = 1;
  std::make_unique<optimization::common_expr_del::Common_Expr_Del,bool>(in_stack_fffffffffffff8d8);
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::common_expr_del::Common_Expr_Del,std::default_delete<optimization::common_expr_del::Common_Expr_Del>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::common_expr_del::Common_Expr_Del,_std::default_delete<optimization::common_expr_del::Common_Expr_Del>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::common_expr_del::Common_Expr_Del,_std::default_delete<optimization::common_expr_del::Common_Expr_Del>_>
  ::~unique_ptr((unique_ptr<optimization::common_expr_del::Common_Expr_Del,_std::default_delete<optimization::common_expr_del::Common_Expr_Del>_>
                 *)in_stack_fffffffffffff8c0);
  local_209 = 1;
  std::make_unique<optimization::global_expr_move::Global_Expr_Mov,bool>(in_stack_fffffffffffff8d8);
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::global_expr_move::Global_Expr_Mov,std::default_delete<optimization::global_expr_move::Global_Expr_Mov>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::global_expr_move::Global_Expr_Mov,_std::default_delete<optimization::global_expr_move::Global_Expr_Mov>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::global_expr_move::Global_Expr_Mov,_std::default_delete<optimization::global_expr_move::Global_Expr_Mov>_>
  ::~unique_ptr((unique_ptr<optimization::global_expr_move::Global_Expr_Mov,_std::default_delete<optimization::global_expr_move::Global_Expr_Mov>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,_std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,_std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>_>
  ::~unique_ptr((unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,_std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::algebraic_simplification::AlgebraicSimplification>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::algebraic_simplification::AlgebraicSimplification,std::default_delete<optimization::algebraic_simplification::AlgebraicSimplification>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::algebraic_simplification::AlgebraicSimplification,_std::default_delete<optimization::algebraic_simplification::AlgebraicSimplification>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::algebraic_simplification::AlgebraicSimplification,_std::default_delete<optimization::algebraic_simplification::AlgebraicSimplification>_>
  ::~unique_ptr((unique_ptr<optimization::algebraic_simplification::AlgebraicSimplification,_std::default_delete<optimization::algebraic_simplification::AlgebraicSimplification>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::value_shift_collapse::ValueShiftCollapse>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::value_shift_collapse::ValueShiftCollapse,std::default_delete<optimization::value_shift_collapse::ValueShiftCollapse>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::value_shift_collapse::ValueShiftCollapse,_std::default_delete<optimization::value_shift_collapse::ValueShiftCollapse>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::value_shift_collapse::ValueShiftCollapse,_std::default_delete<optimization::value_shift_collapse::ValueShiftCollapse>_>
  ::~unique_ptr((unique_ptr<optimization::value_shift_collapse::ValueShiftCollapse,_std::default_delete<optimization::value_shift_collapse::ValueShiftCollapse>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::mla::MlaPass>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::mla::MlaPass,std::default_delete<optimization::mla::MlaPass>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::mla::MlaPass,_std::default_delete<optimization::mla::MlaPass>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::unique_ptr<optimization::mla::MlaPass,_std::default_delete<optimization::mla::MlaPass>_>::
  ~unique_ptr((unique_ptr<optimization::mla::MlaPass,_std::default_delete<optimization::mla::MlaPass>_>
               *)in_stack_fffffffffffff8c0);
  std::make_unique<backend::codegen::BasicBlkRearrange>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<backend::codegen::BasicBlkRearrange,std::default_delete<backend::codegen::BasicBlkRearrange>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<backend::codegen::BasicBlkRearrange,_std::default_delete<backend::codegen::BasicBlkRearrange>_>
  ::~unique_ptr((unique_ptr<backend::codegen::BasicBlkRearrange,_std::default_delete<backend::codegen::BasicBlkRearrange>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::complex_dce::ComplexDeadCodeElimination>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::complex_dce::ComplexDeadCodeElimination,std::default_delete<optimization::complex_dce::ComplexDeadCodeElimination>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::complex_dce::ComplexDeadCodeElimination,_std::default_delete<optimization::complex_dce::ComplexDeadCodeElimination>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::complex_dce::ComplexDeadCodeElimination,_std::default_delete<optimization::complex_dce::ComplexDeadCodeElimination>_>
  ::~unique_ptr((unique_ptr<optimization::complex_dce::ComplexDeadCodeElimination,_std::default_delete<optimization::complex_dce::ComplexDeadCodeElimination>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,_std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,_std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>_>
  ::~unique_ptr((unique_ptr<optimization::remove_dead_code::Remove_Dead_Code,_std::default_delete<optimization::remove_dead_code::Remove_Dead_Code>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::mergeBlocks::Merge_Block>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::mergeBlocks::Merge_Block,std::default_delete<optimization::mergeBlocks::Merge_Block>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::mergeBlocks::Merge_Block,_std::default_delete<optimization::mergeBlocks::Merge_Block>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::mergeBlocks::Merge_Block,_std::default_delete<optimization::mergeBlocks::Merge_Block>_>
  ::~unique_ptr((unique_ptr<optimization::mergeBlocks::Merge_Block,_std::default_delete<optimization::mergeBlocks::Merge_Block>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::func_array_global::Func_Array_Global>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::func_array_global::Func_Array_Global,std::default_delete<optimization::func_array_global::Func_Array_Global>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::func_array_global::Func_Array_Global,_std::default_delete<optimization::func_array_global::Func_Array_Global>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::func_array_global::Func_Array_Global,_std::default_delete<optimization::func_array_global::Func_Array_Global>_>
  ::~unique_ptr((unique_ptr<optimization::func_array_global::Func_Array_Global,_std::default_delete<optimization::func_array_global::Func_Array_Global>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<backend::codegen::BasicBlkRearrange>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<backend::codegen::BasicBlkRearrange,std::default_delete<backend::codegen::BasicBlkRearrange>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<backend::codegen::BasicBlkRearrange,_std::default_delete<backend::codegen::BasicBlkRearrange>_>
  ::~unique_ptr((unique_ptr<backend::codegen::BasicBlkRearrange,_std::default_delete<backend::codegen::BasicBlkRearrange>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<optimization::ref_count::Ref_Count>();
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::ref_count::Ref_Count,std::default_delete<optimization::ref_count::Ref_Count>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::ref_count::Ref_Count,_std::default_delete<optimization::ref_count::Ref_Count>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::ref_count::Ref_Count,_std::default_delete<optimization::ref_count::Ref_Count>_>
  ::~unique_ptr((unique_ptr<optimization::ref_count::Ref_Count,_std::default_delete<optimization::ref_count::Ref_Count>_>
                 *)in_stack_fffffffffffff8c0);
  local_308._52_4_ = 7;
  local_308[0x33] = 1;
  std::make_unique<optimization::graph_color::Graph_Color,int,bool>
            (in_stack_fffffffffffff8e8,in_stack_fffffffffffff8e0);
  std::unique_ptr<backend::MirOptimizePass,std::default_delete<backend::MirOptimizePass>>::
  unique_ptr<optimization::graph_color::Graph_Color,std::default_delete<optimization::graph_color::Graph_Color>,void>
            ((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8d0,
             (unique_ptr<optimization::graph_color::Graph_Color,_std::default_delete<optimization::graph_color::Graph_Color>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass
            (in_stack_fffffffffffff8c0,
             (unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_> *
             )in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::MirOptimizePass,_std::default_delete<backend::MirOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<optimization::graph_color::Graph_Color,_std::default_delete<optimization::graph_color::Graph_Color>_>
  ::~unique_ptr((unique_ptr<optimization::graph_color::Graph_Color,_std::default_delete<optimization::graph_color::Graph_Color>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<backend::codegen::MathOptimization>();
  std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>::
  unique_ptr<backend::codegen::MathOptimization,std::default_delete<backend::codegen::MathOptimization>,void>
            (in_stack_fffffffffffff8d0,
             (unique_ptr<backend::codegen::MathOptimization,_std::default_delete<backend::codegen::MathOptimization>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<backend::codegen::MathOptimization,_std::default_delete<backend::codegen::MathOptimization>_>
  ::~unique_ptr((unique_ptr<backend::codegen::MathOptimization,_std::default_delete<backend::codegen::MathOptimization>_>
                 *)in_stack_fffffffffffff8c0);
  std::make_unique<backend::codegen::RegAllocatePass>();
  std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>::
  unique_ptr<backend::codegen::RegAllocatePass,std::default_delete<backend::codegen::RegAllocatePass>,void>
            (in_stack_fffffffffffff8d0,
             (unique_ptr<backend::codegen::RegAllocatePass,_std::default_delete<backend::codegen::RegAllocatePass>_>
              *)in_stack_fffffffffffff8c8);
  ::backend::Backend::add_pass(in_stack_fffffffffffff8c0,in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
               *)in_stack_fffffffffffff8c0);
  std::
  unique_ptr<backend::codegen::RegAllocatePass,_std::default_delete<backend::codegen::RegAllocatePass>_>
  ::~unique_ptr((unique_ptr<backend::codegen::RegAllocatePass,_std::default_delete<backend::codegen::RegAllocatePass>_>
                 *)in_stack_fffffffffffff8c0);
  this = (Backend *)local_308;
  std::make_unique<backend::optimization::ExcessRegDelete>();
  std::unique_ptr<backend::ArmOptimizePass,std::default_delete<backend::ArmOptimizePass>>::
  unique_ptr<backend::optimization::ExcessRegDelete,std::default_delete<backend::optimization::ExcessRegDelete>,void>
            ((unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_> *
             )(local_308 + 8),local_8);
  ::backend::Backend::add_pass(this,in_stack_fffffffffffff8b8);
  std::unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>::
  ~unique_ptr((unique_ptr<backend::ArmOptimizePass,_std::default_delete<backend::ArmOptimizePass>_>
               *)this);
  std::
  unique_ptr<backend::optimization::ExcessRegDelete,_std::default_delete<backend::optimization::ExcessRegDelete>_>
  ::~unique_ptr((unique_ptr<backend::optimization::ExcessRegDelete,_std::default_delete<backend::optimization::ExcessRegDelete>_>
                 *)this);
  return;
}

Assistant:

void add_passes(backend::Backend& backend) {
  backend.add_pass(std::make_unique<optimization::sanity_check::SanityCheck>());
  backend.add_pass(
      std::make_unique<optimization::remove_temp_var::Remove_Temp_Var>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  backend.add_pass(std::make_unique<optimization::var_mir_fold::VarMirFold>());
  backend.add_pass(
      std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  backend.add_pass(std::make_unique<optimization::inlineFunc::Inline_Func>());
  backend.add_pass(std::make_unique<optimization::mergeBlocks::Merge_Block>());
  // inside block only and remove tmp vars
  backend.add_pass(
      std::make_unique<optimization::common_expr_del::Common_Expr_Del>());

  backend.add_pass(
      std::make_unique<optimization::global_expr_move::Global_Expr_Mov>());

  // delete common exprs new created and replace not phi vars
  backend.add_pass(
      std::make_unique<optimization::common_expr_del::Common_Expr_Del>());
  backend.add_pass(
      std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());

  backend.add_pass(std::make_unique<
                   optimization::memvar_propagation::Memory_Var_Propagation>());
  backend.add_pass(std::make_unique<optimization::const_merge::Merge_Const>());
  backend.add_pass(std::make_unique<
                   optimization::memvar_propagation::Memory_Var_Propagation>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  // backend.add_pass(
  //     std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  backend.add_pass(
      std::make_unique<optimization::loop_expand::Const_Loop_Expand>());
  // backend.add_pass(
  //     std::make_unique<optimization::loop_unrolling::Loop_Unrolling>());
  // backend.add_pass(
  //     std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  // backend.add_pass(
  //     std::make_unique<optimization::common_expr_del::Common_Expr_Del>());
  backend.add_pass(std::make_unique<optimization::mergeBlocks::Merge_Block>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  backend.add_pass(std::make_unique<optimization::const_merge::Merge_Const>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  backend.add_pass(
      std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  backend.add_pass(
      std::make_unique<optimization::common_expr_del::Common_Expr_Del>());

  backend.add_pass(std::make_unique<
                   optimization::memvar_propagation::Memory_Var_Propagation>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  backend.add_pass(std::make_unique<optimization::const_merge::Merge_Const>());
  backend.add_pass(
      std::make_unique<optimization::const_propagation::Const_Propagation>());
  backend.add_pass(std::make_unique<optimization::cast_inst::Cast_Inst>());
  backend.add_pass(
      std::make_unique<
          optimization::memvar_propagation::Memory_Var_Propagation>(true));
  backend.add_pass(
      std::make_unique<optimization::common_expr_del::Common_Expr_Del>(true));
  backend.add_pass(
      std::make_unique<optimization::global_expr_move::Global_Expr_Mov>(true));
  backend.add_pass(
      std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  backend.add_pass(
      std::make_unique<
          optimization::algebraic_simplification::AlgebraicSimplification>());
  backend.add_pass(std::make_unique<
                   optimization::value_shift_collapse::ValueShiftCollapse>());
  backend.add_pass(std::make_unique<optimization::mla::MlaPass>());
  backend.add_pass(std::make_unique<backend::codegen::BasicBlkRearrange>());
  backend.add_pass(std::make_unique<
                   optimization::complex_dce::ComplexDeadCodeElimination>());
  backend.add_pass(
      std::make_unique<optimization::remove_dead_code::Remove_Dead_Code>());
  // backend.add_pass(std::make_unique<optimization::cycle::Cycle>());
  // backend.add_pass(std::make_unique<optimization::exit_ahead::Exit_Ahead>());
  backend.add_pass(std::make_unique<optimization::mergeBlocks::Merge_Block>());
  backend.add_pass(
      std::make_unique<optimization::func_array_global::Func_Array_Global>());
  backend.add_pass(std::make_unique<backend::codegen::BasicBlkRearrange>());
  // fft will error.
  // backend.add_pass(std::make_unique<
  //                  optimization::global_var_to_local::Global_Var_to_Local>());
  backend.add_pass(std::make_unique<optimization::ref_count::Ref_Count>());
  backend.add_pass(
      std::make_unique<optimization::graph_color::Graph_Color>(7, true));

  // ARM Passes
  backend.add_pass(std::make_unique<backend::codegen::MathOptimization>());
  backend.add_pass(std::make_unique<backend::codegen::RegAllocatePass>());
  backend.add_pass(std::make_unique<backend::optimization::ExcessRegDelete>());
  // backend.add_pass(std::make_unique<backend::codegen::CodeAlignOptimization>());
}